

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_for.cpp
# Opt level: O3

int main(void)

{
  short sVar1;
  char *__s;
  mapped_type *pmVar2;
  size_t sVar3;
  ostream *poVar4;
  _Rb_tree_node_base *p_Var5;
  char *local_38;
  
  local_38 = "Adrian";
  pmVar2 = std::
           map<const_char_*,_short,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_short>_>_>
           ::operator[](&person,&local_38);
  *pmVar2 = 0x3df;
  local_38 = "Kerrie";
  pmVar2 = std::
           map<const_char_*,_short,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_short>_>_>
           ::operator[](&person,&local_38);
  *pmVar2 = 0x390;
  local_38 = "Nicholas";
  pmVar2 = std::
           map<const_char_*,_short,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_short>_>_>
           ::operator[](&person,&local_38);
  *pmVar2 = 0x69;
  local_38 = "Elizabeth";
  pmVar2 = std::
           map<const_char_*,_short,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_short>_>_>
           ::operator[](&person,&local_38);
  *pmVar2 = 0xe7;
  local_38 = "Wilson";
  pmVar2 = std::
           map<const_char_*,_short,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_short>_>_>
           ::operator[](&person,&local_38);
  *pmVar2 = 0x36a;
  local_38 = "Joyce";
  pmVar2 = std::
           map<const_char_*,_short,_std::less<const_char_*>,_std::allocator<std::pair<const_char_*const,_short>_>_>
           ::operator[](&person,&local_38);
  *pmVar2 = 0xe4;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  p_Var5 = person._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)person._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &person._M_t._M_impl.super__Rb_tree_header) {
    do {
      __s = *(char **)(p_Var5 + 1);
      sVar1 = *(short *)&p_Var5[1]._M_parent;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[\"",2);
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x106078);
      }
      else {
        sVar3 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\"]",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"=\t",2);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,sVar1);
      local_38 = (char *)CONCAT71(local_38._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_38,1);
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != &person._M_t._M_impl.super__Rb_tree_header);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  return 0;
}

Assistant:

int main () {
	//Let's give the map values;
	person["Adrian"] 	= 991;
	person["Kerrie"] 	= 912;
	person["Nicholas"] 	= 105;
	person["Elizabeth"] = 231;
	person["Wilson"] 	= 874;
	person["Joyce"] 	= 228;

	std::cout << std::endl;
	for (auto[x,y] : person) {
		std::cout << "[\"" << x << "\"]" << "=\t" << y << '\n';
	}
	std::cout << std::endl;
}